

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ribbon_artist.cpp
# Opt level: O2

void __thiscall polyscope::RibbonArtist::createProgram(RibbonArtist *this)

{
  vec<3,_float,_(glm::qualifier)0> *v1;
  shared_ptr<polyscope::render::ShaderProgram> *this_00;
  element_type *peVar1;
  pointer pvVar2;
  double dVar3;
  undefined1 auVar4 [16];
  Engine *pEVar5;
  pointer paVar6;
  ValueColorMap *this_01;
  ulong uVar7;
  vec<3,float,(glm::qualifier)0> *this_02;
  value_type *__x;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar8;
  undefined1 auVar9 [16];
  double val;
  undefined1 auVar16 [56];
  undefined1 auVar10 [64];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  vec<3,_float,_(glm::qualifier)0> vVar17;
  vec3 vVar18;
  undefined8 local_198;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_190;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
  line;
  uint restartInd;
  undefined8 local_158;
  float local_150;
  value_type local_148;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  colors;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  positions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  value_type local_a0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  pEVar5 = render::engine;
  std::__cxx11::string::string((string *)&positions,"RIBBON",(allocator *)&indices);
  normals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  normals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  normals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*pEVar5->_vptr_Engine[0x23])(&colors,pEVar5,&positions,&normals,0);
  this_00 = &this->program;
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)&colors);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &colors.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&normals);
  std::__cxx11::string::~string((string *)&positions);
  restartInd = 0xffffffff;
  peVar1 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_ShaderProgram[0x1d])(peVar1,0xffffffffffffffff);
  dVar3 = state::lengthScale * this->normalOffsetFraction;
  positions.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  normals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colors.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  positions.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positions.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  normals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  normals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  colors.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colors.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = render::Engine::getColorMap(render::engine,&this->cMap);
  uVar7 = 0;
  aVar8.x = 0.0;
  while( true ) {
    pvVar2 = (this->ribbons).
             super__Vector_base<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->ribbons).
                       super__Vector_base<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>,_std::allocator<std::vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) <= uVar7)
    break;
    std::
    vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
    ::vector(&line,pvVar2 + uVar7);
    paVar6 = line.
             super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (vec<3,float,(glm::qualifier)0> *)
                   line.
                   super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_02 != (vec<3,float,(glm::qualifier)0> *)paVar6; this_02 = this_02 + 0x18) {
      auVar16 = (undefined1  [56])0x0;
      vVar17 = glm::operator*((vec<3,_float,_(glm::qualifier)0> *)(this_02 + 0xc),(float)dVar3);
      local_148.field_2 = vVar17.field_2;
      auVar10._0_8_ = vVar17._0_8_;
      auVar10._8_56_ = auVar16;
      local_148._0_8_ = vmovlps_avx(auVar10._0_16_);
      glm::vec<3,float,(glm::qualifier)0>::operator+=(this_02,&local_148);
    }
    if (1 < (ulong)(((long)line.
                           super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)line.
                          super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      val = randomUnit();
      auVar16 = extraout_var;
      vVar18 = render::ValueColorMap::getValue(this_01,val);
      paVar6 = line.
               super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_148.field_2 = vVar18.field_2;
      auVar11._0_8_ = vVar18._0_8_;
      auVar11._8_56_ = auVar16;
      local_148._0_8_ = vmovlps_avx(auVar11._0_16_);
      vVar17 = glm::operator-((line.
                               super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_elems,
                              line.
                              super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_elems);
      auVar12._0_8_ = vVar17._0_8_;
      auVar12._8_56_ = auVar16;
      auVar9._8_4_ = 0x3c23d70a;
      auVar9._0_8_ = 0x3c23d70a3c23d70a;
      auVar9._12_4_ = 0x3c23d70a;
      auVar9 = vmulps_avx512vl(auVar12._0_16_,auVar9);
      auVar16 = ZEXT856(auVar9._8_8_);
      local_190.z = vVar17.field_2.z * 0.01;
      local_198 = vmovlps_avx(auVar9);
      vVar17 = glm::operator+(paVar6->_M_elems,(vec<3,_float,_(glm::qualifier)0> *)&local_198);
      local_a0.field_2 = vVar17.field_2;
      auVar13._0_8_ = vVar17._0_8_;
      auVar13._8_56_ = auVar16;
      local_a0._0_8_ = vmovlps_avx(auVar13._0_16_);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back(&positions,&local_a0);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back(&normals,(line.
                            super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 1);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back(&colors,&local_148);
      local_198._0_4_ = aVar8.x;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&indices,(uint *)&local_198);
      paVar6 = line.
               super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      aVar8.x = aVar8.x + 2;
      __x = (line.
             super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
      while( true ) {
        auVar16 = auVar13._8_56_;
        if (__x == paVar6->_M_elems) break;
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back(&positions,__x);
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back(&normals,__x + 1);
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back(&colors,&local_148);
        local_198._0_4_ = aVar8.x + -1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indices,(uint *)&local_198);
        aVar8.x = aVar8.x + 1;
        __x = __x + 2;
      }
      v1 = line.
           super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems;
      vVar17 = glm::operator-(v1,line.
                                 super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-2]._M_elems);
      auVar14._0_8_ = vVar17._0_8_;
      auVar14._8_56_ = auVar16;
      auVar4._8_4_ = 0x3c23d70a;
      auVar4._0_8_ = 0x3c23d70a3c23d70a;
      auVar4._12_4_ = 0x3c23d70a;
      auVar9 = vmulps_avx512vl(auVar14._0_16_,auVar4);
      auVar16 = ZEXT856(auVar9._8_8_);
      local_150 = vVar17.field_2.z * 0.01;
      local_158 = vmovlps_avx(auVar9);
      vVar17 = glm::operator+(v1,(vec<3,_float,_(glm::qualifier)0> *)&local_158);
      local_190 = vVar17.field_2;
      auVar15._0_8_ = vVar17._0_8_;
      auVar15._8_56_ = auVar16;
      local_198 = vmovlps_avx(auVar15._0_16_);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back(&positions,(value_type *)&local_198);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back(&normals,line.
                           super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems + 1);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back(&colors,&local_148);
      local_158._0_4_ = aVar8.x + -1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&indices,(uint *)&local_158);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&indices,&restartInd);
    }
    std::
    _Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
    ::~_Vector_base(&line.
                     super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_>
                   );
    uVar7 = uVar7 + 1;
  }
  peVar1 = (this_00->
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string(local_50,"a_position",(allocator *)&line);
  (*peVar1->_vptr_ShaderProgram[0x10])(peVar1,local_50,&positions,0,0,0xffffffffffffffff);
  std::__cxx11::string::~string(local_50);
  peVar1 = (this_00->
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string(local_70,"a_normal",(allocator *)&line);
  (*peVar1->_vptr_ShaderProgram[0x10])(peVar1,local_70,&normals,0,0,0xffffffffffffffff);
  std::__cxx11::string::~string(local_70);
  peVar1 = (this_00->
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string(local_90,"a_color",(allocator *)&line);
  (*peVar1->_vptr_ShaderProgram[0x10])(peVar1,local_90,&colors,0,0,0xffffffffffffffff);
  std::__cxx11::string::~string(local_90);
  peVar1 = (this_00->
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_ShaderProgram[0x1c])(peVar1,&indices);
  render::Engine::setMaterial
            (render::engine,
             (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,&(this->material).value);
  geometrycentral::surface::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::
  ~_Vector_base((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&indices);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&colors.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 );
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&normals.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 );
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&positions.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 );
  return;
}

Assistant:

void RibbonArtist::createProgram() {

  // Create the program
  program = render::engine->requestShader("RIBBON", {});

  // Set the restart index for the line strip
  unsigned int restartInd = -1;
  program->setPrimitiveRestartIndex(restartInd);

  // Compute length scales and whatnot
  float normalOffset = static_cast<float>(state::lengthScale * normalOffsetFraction);

  // == Fill buffers

  // Trace a whole bunch of lines along the surface
  std::vector<glm::vec3> positions;
  std::vector<glm::vec3> normals;
  std::vector<glm::vec3> colors;
  std::vector<unsigned int> indices;
  unsigned int nPts = 0;
  const render::ValueColorMap& cmapValue = render::engine->getColorMap(cMap);
  for (size_t iLine = 0; iLine < ribbons.size(); iLine++) {

    // Process each point from the list
    std::vector<std::array<glm::vec3, 2>> line = ribbons[iLine];

    // Offset points along normals
    for (std::array<glm::vec3, 2>& x : line) {
      x[0] += x[1] * normalOffset;
    }

    // Fill the render buffer for this line
    if (line.size() <= 1) {
      continue;
    }

    // Sample a color for this line
    glm::vec3 lineColor = cmapValue.getValue(randomUnit());

    // Add a false point at the beginning (so it's not a special case for the geometry shader)
    float EPS = 0.01;
    glm::vec3 fakeFirst = line[0][0] + EPS * (line[0][0] - line[1][0]);
    positions.push_back(fakeFirst);
    normals.push_back(line.front()[1]);
    colors.push_back(lineColor);
    indices.push_back(nPts++);

    // Add all of the real points
    for (auto& pn : line) {
      positions.push_back(pn[0]);
      normals.push_back(pn[1]);
      colors.push_back(lineColor);
      indices.push_back(nPts++);
    }

    // Add a false point at the end too
    glm::vec3 fakeLast = line.back()[0] + EPS * (line.back()[0] - line[line.size() - 2][0]);
    positions.push_back(fakeLast);
    normals.push_back(line.back()[1]);
    colors.push_back(lineColor);
    indices.push_back(nPts++);

    // Restart index allows us to draw multiple lines from a single buffer
    indices.push_back(restartInd);
  }

  // Store the values in GL buffers
  program->setAttribute("a_position", positions);
  program->setAttribute("a_normal", normals);
  program->setAttribute("a_color", colors);
  program->setIndex(indices);

  render::engine->setMaterial(*program, material.get());
}